

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall leveldb::DBTest_BloomFilter_Test::TestBody(DBTest_BloomFilter_Test *this)

{
  size_type *psVar1;
  DB *pDVar2;
  undefined8 *puVar3;
  size_type sVar4;
  long *plVar5;
  int iVar6;
  int i;
  int i_00;
  int i_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var7;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_04;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_05;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_07;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_09;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_10;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_12;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_14;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_15;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_17;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_18;
  undefined8 uVar8;
  string *this_00;
  char *pcVar9;
  uint uVar10;
  leveldb *plVar11;
  AssertionResult AVar12;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int reads;
  int N;
  Options options;
  undefined1 local_129;
  string local_128;
  string local_108;
  string local_e8;
  void *local_c8;
  int local_bc;
  string local_b8;
  undefined1 local_98 [24];
  SpecialEnv *local_80;
  Cache *local_60;
  Cache *local_38;
  
  ((this->super_DBTest).env_)->count_random_reads_ = true;
  DBTest::CurrentOptions((Options *)(local_98 + 8),&this->super_DBTest);
  local_80 = (this->super_DBTest).env_;
  plVar11 = (leveldb *)0x0;
  local_60 = NewLRUCache(0);
  local_38 = (Cache *)NewBloomFilterPolicy(10);
  DBTest::Reopen(&this->super_DBTest,(Options *)(local_98 + 8));
  local_bc = 10000;
  _Var7._M_head_impl = extraout_RDX;
  do {
    Key_abi_cxx11_(&local_128,plVar11,(int)_Var7._M_head_impl);
    Key_abi_cxx11_(&local_108,plVar11,i);
    pDVar2 = (this->super_DBTest).db_;
    local_129 = 0;
    local_b8._M_dataplus._M_p = local_128._M_dataplus._M_p;
    local_b8._M_string_length = local_128._M_string_length;
    local_e8._M_dataplus._M_p._0_4_ = local_108._M_dataplus._M_p._0_4_;
    local_e8._M_dataplus._M_p._4_4_ = local_108._M_dataplus._M_p._4_4_;
    local_e8._M_string_length._0_4_ = (undefined4)local_108._M_string_length;
    local_e8._M_string_length._4_4_ = local_108._M_string_length._4_4_;
    (*pDVar2->_vptr_DB[2])(&local_c8,pDVar2,&local_129,&local_b8,&local_e8);
    AVar12 = testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::
             operator()((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)
                        ((long)&local_e8 + 0x10),(char *)&local_b8,(Status *)"Put(Key(i), Key(i))");
    _Var7._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AVar12.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    if (local_c8 != (void *)0x0) {
      operator_delete__(local_c8);
      _Var7 = extraout_RDX_00.
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
      _Var7._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           extraout_RDX_01.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
      _Var7._M_head_impl = extraout_RDX_02;
    }
    uVar8 = local_e8.field_2._8_8_;
    if (local_e8.field_2._M_local_buf[0] == '\0') {
      testing::Message::Message((Message *)&local_128);
      if ((undefined8 *)local_e8.field_2._8_8_ == (undefined8 *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)local_e8.field_2._8_8_;
      }
      iVar6 = 0x75f;
      goto LAB_0012e165;
    }
    if ((undefined8 *)local_e8.field_2._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_e8.field_2._8_8_ != (undefined8 *)(local_e8.field_2._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_e8.field_2._8_8_);
      }
      operator_delete((void *)uVar8);
      _Var7._M_head_impl = extraout_RDX_03._M_head_impl;
    }
    uVar10 = (int)plVar11 + 1;
    plVar11 = (leveldb *)(ulong)uVar10;
  } while (uVar10 != 10000);
  local_128._M_dataplus._M_p = "a";
  local_128._M_string_length = 1;
  local_108._M_dataplus._M_p = "z";
  local_108._M_string_length = 1;
  pDVar2 = (this->super_DBTest).db_;
  (*pDVar2->_vptr_DB[0xb])(pDVar2,&local_128,&local_108);
  uVar10 = 0xffffff9c;
  _Var7._M_head_impl = extraout_RDX_04;
LAB_0012dc39:
  uVar10 = uVar10 + 100;
  Key_abi_cxx11_(&local_128,(leveldb *)(ulong)uVar10,(int)_Var7._M_head_impl);
  Key_abi_cxx11_(&local_108,(leveldb *)(ulong)uVar10,i_00);
  pDVar2 = (this->super_DBTest).db_;
  local_129 = 0;
  local_b8._M_dataplus._M_p = local_128._M_dataplus._M_p;
  local_b8._M_string_length = local_128._M_string_length;
  local_e8._M_dataplus._M_p._0_4_ = local_108._M_dataplus._M_p._0_4_;
  local_e8._M_dataplus._M_p._4_4_ = local_108._M_dataplus._M_p._4_4_;
  local_e8._M_string_length._0_4_ = (undefined4)local_108._M_string_length;
  local_e8._M_string_length._4_4_ = local_108._M_string_length._4_4_;
  (*pDVar2->_vptr_DB[2])(&local_c8,pDVar2,&local_129,&local_b8,&local_e8);
  AVar12 = testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
                     ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)
                      ((long)&local_e8 + 0x10),(char *)&local_b8,(Status *)"Put(Key(i), Key(i))");
  _Var7._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar12.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_c8 != (void *)0x0) {
    operator_delete__(local_c8);
    _Var7 = extraout_RDX_05.
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
    _Var7._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_06.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
    _Var7._M_head_impl = extraout_RDX_07;
  }
  uVar8 = local_e8.field_2._8_8_;
  if (local_e8.field_2._M_local_buf[0] != '\0') goto code_r0x0012dce2;
  testing::Message::Message((Message *)&local_128);
  if ((undefined8 *)local_e8.field_2._8_8_ == (undefined8 *)0x0) {
    pcVar9 = "";
  }
  else {
    pcVar9 = *(char **)local_e8.field_2._8_8_;
  }
  iVar6 = 0x763;
LAB_0012e165:
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_108,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
             ,iVar6,pcVar9);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_128);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
  uVar8 = local_e8.field_2._8_8_;
  if ((long *)local_128._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_128._M_dataplus._M_p + 8))();
    uVar8 = local_e8.field_2._8_8_;
  }
  goto LAB_0012e1e7;
code_r0x0012dce2:
  if ((undefined8 *)local_e8.field_2._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_e8.field_2._8_8_ != (undefined8 *)(local_e8.field_2._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_e8.field_2._8_8_);
    }
    operator_delete((void *)uVar8);
    _Var7._M_head_impl = extraout_RDX_08._M_head_impl;
  }
  if (0x26ab < uVar10) goto code_r0x0012dd11;
  goto LAB_0012dc39;
code_r0x0012dd11:
  DBImpl::TEST_CompactMemTable((DBImpl *)local_98);
  if ((_func_int **)local_98._0_8_ != (_func_int **)0x0) {
    operator_delete__((void *)local_98._0_8_);
  }
  (((this->super_DBTest).env_)->delay_data_sync_)._M_base._M_i = true;
  anon_unknown_4::AtomicCounter::Reset(&((this->super_DBTest).env_)->random_read_counter_);
  uVar10 = 0;
  _Var7._M_head_impl = extraout_RDX_09;
  do {
    Key_abi_cxx11_(&local_128,(leveldb *)(ulong)uVar10,(int)_Var7._M_head_impl);
    Key_abi_cxx11_(&local_b8,(leveldb *)(ulong)uVar10,i_01);
    DBTest::Get(&local_108,&this->super_DBTest,&local_b8,(Snapshot *)0x0);
    AVar12 = testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                       ((internal *)&local_e8,"Key(i)","Get(Key(i))",&local_128,&local_108);
    _Var7._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AVar12.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
      _Var7 = extraout_RDX_10.
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
      _Var7._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           extraout_RDX_11.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
      _Var7._M_head_impl = extraout_RDX_12;
    }
    if (local_e8._M_dataplus._M_p._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_128);
      if ((undefined8 *)
          CONCAT44(local_e8._M_string_length._4_4_,(undefined4)local_e8._M_string_length) ==
          (undefined8 *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)CONCAT44(local_e8._M_string_length._4_4_,
                                    (undefined4)local_e8._M_string_length);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x76d,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if ((long *)local_128._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_128._M_dataplus._M_p + 8))();
      }
      uVar8 = (undefined8 *)
              CONCAT44(local_e8._M_string_length._4_4_,(undefined4)local_e8._M_string_length);
      goto LAB_0012e1e7;
    }
    puVar3 = (undefined8 *)
             CONCAT44(local_e8._M_string_length._4_4_,(undefined4)local_e8._M_string_length);
    if (puVar3 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar3 != puVar3 + 2) {
        operator_delete((undefined8 *)*puVar3);
      }
      operator_delete(puVar3);
      _Var7._M_head_impl = extraout_RDX_13._M_head_impl;
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != 10000);
  local_e8.field_2._M_allocated_capacity._0_4_ =
       anon_unknown_4::AtomicCounter::Read(&((this->super_DBTest).env_)->random_read_counter_);
  fprintf(_stderr,"%d present => %d reads\n",10000,
          (ulong)(uint)local_e8.field_2._M_allocated_capacity._0_4_);
  testing::internal::CmpHelperGE<int,int>
            ((internal *)&local_128,"reads","N",(int *)((long)&local_e8 + 0x10),&local_bc);
  sVar4 = local_128._M_string_length;
  if ((char)local_128._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_108);
    if ((undefined8 *)local_128._M_string_length == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)local_128._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x771,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    uVar8 = local_128._M_string_length;
    if ((long *)local_108._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_108._M_dataplus._M_p + 8))();
      uVar8 = local_128._M_string_length;
    }
LAB_0012e1e7:
    if ((undefined8 *)uVar8 != (undefined8 *)0x0) {
      if (*(undefined8 **)uVar8 != (undefined8 *)(uVar8 + 0x10)) {
        operator_delete(*(undefined8 **)uVar8);
      }
      operator_delete((void *)uVar8);
    }
  }
  else {
    if ((undefined8 *)local_128._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_128._M_string_length !=
          (undefined8 *)(local_128._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_128._M_string_length);
      }
      operator_delete((void *)sVar4);
    }
    local_108._M_dataplus._M_p._0_4_ = 0x27d8;
    testing::internal::CmpHelperLE<int,int>
              ((internal *)&local_128,"reads","N + 2 * N / 100",(int *)((long)&local_e8 + 0x10),
               (int *)&local_108);
    if ((char)local_128._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_108);
      if ((undefined8 *)local_128._M_string_length == (undefined8 *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)local_128._M_string_length;
      }
      iVar6 = 0x772;
    }
    else {
      testing::AssertionResult::~AssertionResult((AssertionResult *)&local_128);
      anon_unknown_4::AtomicCounter::Reset(&((this->super_DBTest).env_)->random_read_counter_);
      plVar11 = (leveldb *)0x0;
      _Var7._M_head_impl = extraout_RDX_14;
      do {
        Key_abi_cxx11_(&local_b8,plVar11,(int)_Var7._M_head_impl);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        psVar1 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_108.field_2._M_allocated_capacity = *psVar1;
          local_108.field_2._8_8_ = plVar5[3];
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar1;
          local_108._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_108._M_string_length = plVar5[1];
        *plVar5 = (long)psVar1;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        DBTest::Get(&local_128,&this->super_DBTest,&local_108,(Snapshot *)0x0);
        AVar12 = testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
                           ((internal *)&local_e8,"\"NOT_FOUND\"","Get(Key(i) + \".missing\")",
                            (char (*) [10])"NOT_FOUND",&local_128);
        _Var7._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             AVar12.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
          _Var7 = extraout_RDX_15.
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
          _Var7._M_head_impl =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               extraout_RDX_16.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
          _Var7._M_head_impl = extraout_RDX_17;
        }
        if (local_e8._M_dataplus._M_p._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_128);
          if ((undefined8 *)
              CONCAT44(local_e8._M_string_length._4_4_,(undefined4)local_e8._M_string_length) ==
              (undefined8 *)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = *(char **)CONCAT44(local_e8._M_string_length._4_4_,
                                        (undefined4)local_e8._M_string_length);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_108,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                     ,0x777,pcVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_108,(Message *)&local_128);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
          if ((long *)local_128._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_128._M_dataplus._M_p + 8))();
          }
          this_00 = &local_e8;
          goto LAB_0012e366;
        }
        puVar3 = (undefined8 *)
                 CONCAT44(local_e8._M_string_length._4_4_,(undefined4)local_e8._M_string_length);
        if (puVar3 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar3 != puVar3 + 2) {
            operator_delete((undefined8 *)*puVar3);
          }
          operator_delete(puVar3);
          _Var7._M_head_impl = extraout_RDX_18._M_head_impl;
        }
        uVar10 = (int)plVar11 + 1;
        plVar11 = (leveldb *)(ulong)uVar10;
      } while (uVar10 != 10000);
      local_e8.field_2._M_allocated_capacity._0_4_ =
           anon_unknown_4::AtomicCounter::Read(&((this->super_DBTest).env_)->random_read_counter_);
      fprintf(_stderr,"%d missing => %d reads\n",10000,
              (ulong)(uint)local_e8.field_2._M_allocated_capacity._0_4_);
      local_108._M_dataplus._M_p._0_4_ = 300;
      testing::internal::CmpHelperLE<int,int>
                ((internal *)&local_128,"reads","3 * N / 100",(int *)((long)&local_e8 + 0x10),
                 (int *)&local_108);
      if ((char)local_128._M_dataplus._M_p != '\0') {
        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_128);
        (((this->super_DBTest).env_)->delay_data_sync_)._M_base._M_i = false;
        pDVar2 = (this->super_DBTest).db_;
        if (pDVar2 != (DB *)0x0) {
          (*pDVar2->_vptr_DB[1])();
        }
        (this->super_DBTest).db_ = (DB *)0x0;
        if (local_60 != (Cache *)0x0) {
          (*local_60->_vptr_Cache[1])();
        }
        if (local_38 == (Cache *)0x0) {
          return;
        }
        (*local_38->_vptr_Cache[1])();
        return;
      }
      testing::Message::Message((Message *)&local_108);
      if ((undefined8 *)local_128._M_string_length == (undefined8 *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)local_128._M_string_length;
      }
      iVar6 = 0x77b;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,iVar6,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_108._M_dataplus._M_p + 8))();
    }
    this_00 = &local_128;
LAB_0012e366:
    testing::AssertionResult::~AssertionResult((AssertionResult *)this_00);
  }
  return;
}

Assistant:

TEST_F(DBTest, BloomFilter) {
  env_->count_random_reads_ = true;
  Options options = CurrentOptions();
  options.env = env_;
  options.block_cache = NewLRUCache(0);  // Prevent cache hits
  options.filter_policy = NewBloomFilterPolicy(10);
  Reopen(&options);

  // Populate multiple layers
  const int N = 10000;
  for (int i = 0; i < N; i++) {
    ASSERT_LEVELDB_OK(Put(Key(i), Key(i)));
  }
  Compact("a", "z");
  for (int i = 0; i < N; i += 100) {
    ASSERT_LEVELDB_OK(Put(Key(i), Key(i)));
  }
  dbfull()->TEST_CompactMemTable();

  // Prevent auto compactions triggered by seeks
  env_->delay_data_sync_.store(true, std::memory_order_release);

  // Lookup present keys.  Should rarely read from small sstable.
  env_->random_read_counter_.Reset();
  for (int i = 0; i < N; i++) {
    ASSERT_EQ(Key(i), Get(Key(i)));
  }
  int reads = env_->random_read_counter_.Read();
  std::fprintf(stderr, "%d present => %d reads\n", N, reads);
  ASSERT_GE(reads, N);
  ASSERT_LE(reads, N + 2 * N / 100);

  // Lookup present keys.  Should rarely read from either sstable.
  env_->random_read_counter_.Reset();
  for (int i = 0; i < N; i++) {
    ASSERT_EQ("NOT_FOUND", Get(Key(i) + ".missing"));
  }
  reads = env_->random_read_counter_.Read();
  std::fprintf(stderr, "%d missing => %d reads\n", N, reads);
  ASSERT_LE(reads, 3 * N / 100);

  env_->delay_data_sync_.store(false, std::memory_order_release);
  Close();
  delete options.block_cache;
  delete options.filter_policy;
}